

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall
pybind11::cpp_function::initialize_generic
          (cpp_function *this,unique_function_record *unique_rec,char *text,type_info **types,
          size_t args)

{
  byte bVar1;
  ushort uVar2;
  pointer paVar3;
  function_record *pfVar4;
  unique_function_record uVar5;
  bool bVar6;
  uint __val;
  uint uVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  long *plVar12;
  type_info *ptVar13;
  handle *phVar14;
  PyTypeObject *pPVar15;
  PyMethodDef *pPVar16;
  object *poVar17;
  PyObject *pPVar18;
  PyObject *pPVar19;
  function_record *pfVar20;
  error_already_set *this_00;
  ushort uVar21;
  PyBufferProcs *pPVar22;
  size_type *psVar23;
  ulong *puVar24;
  ulong uVar25;
  char *text_00;
  descrsetfunc p_Var26;
  function_record *pfVar27;
  undefined8 uVar28;
  char cVar29;
  uint __len;
  pointer paVar30;
  long lVar31;
  function_record *pfVar32;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  string signatures;
  string name;
  object scope_module;
  string signature;
  strdup_guard guarded_strdup;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  string local_1c8;
  function_record *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  enable_if_t<_detail::is_pyobject<basic_string<char>_>::value_&&_detail::move_if_unreferenced<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
  local_160;
  allocator<char> local_139;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  handle *local_118;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *local_110;
  strdup_guard local_108;
  function_record *local_f0;
  PyMemberDef *local_e8;
  undefined1 local_e0 [24];
  handle local_c8;
  descrsetfunc local_c0;
  str local_b8;
  undefined1 local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  
  pfVar32 = (unique_rec->_M_t).
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
  local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar11 = "";
  if (pfVar32->name != (char *)0x0) {
    pcVar11 = pfVar32->name;
  }
  local_118 = (handle *)this;
  local_f0 = (function_record *)types;
  local_c0 = (descrsetfunc)args;
  pcVar11 = strdup_guard::operator()(&local_108,pcVar11);
  pfVar32->name = pcVar11;
  if (pfVar32->doc != (char *)0x0) {
    pcVar11 = strdup_guard::operator()(&local_108,pfVar32->doc);
    pfVar32->doc = pcVar11;
  }
  paVar30 = (pfVar32->args).
            super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            ._M_impl.super__Vector_impl_data._M_start;
  paVar3 = *(pointer *)
            ((long)&(pfVar32->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
            + 8);
  local_1a8 = pfVar32;
  local_e8 = (PyMemberDef *)unique_rec;
  if (paVar30 != paVar3) {
    do {
      if (paVar30->name != (char *)0x0) {
        pcVar11 = strdup_guard::operator()(&local_108,paVar30->name);
        paVar30->name = pcVar11;
      }
      if (paVar30->descr == (char *)0x0) {
        if ((paVar30->value).m_ptr != (PyObject *)0x0) {
          auVar36 = PyObject_Repr((paVar30->value).m_ptr);
          if (auVar36._0_8_ == (PyTypeObject *)0x0) {
            this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
            error_already_set::error_already_set(this_00);
            __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
          }
          local_1e8._0_8_ = auVar36._0_8_;
          cast<std::__cxx11::string>(&local_160,(pybind11 *)local_1e8,auVar36._8_8_);
          pcVar11 = strdup_guard::operator()(&local_108,local_160._M_dataplus._M_p);
          paVar30->descr = pcVar11;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          handle::dec_ref((handle *)local_1e8);
        }
      }
      else {
        pcVar11 = strdup_guard::operator()(&local_108,paVar30->descr);
        paVar30->descr = pcVar11;
      }
      paVar30 = paVar30 + 1;
    } while (paVar30 != paVar3);
  }
  pfVar32 = local_1a8;
  pcVar11 = local_1a8->name;
  iVar9 = strcmp(pcVar11,"__init__");
  if (iVar9 == 0) {
    uVar21 = 1;
  }
  else {
    iVar9 = strcmp(pcVar11,"__setstate__");
    uVar21 = (ushort)(iVar9 == 0);
  }
  uVar2 = *(ushort *)&pfVar32->field_0x59;
  *(ushort *)&pfVar32->field_0x59 = uVar2 & 0xfffe | uVar21;
  if (((uVar2 & 2) == 0 & (byte)uVar21) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,(char *)(pfVar32->scope).m_ptr[1].ob_type,
               (allocator<char> *)local_1e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1e8,pfVar32->name,(allocator<char> *)&local_1c8);
    uVar28 = _PyExc_FutureWarning;
    std::operator+(&local_180,"pybind11-bound class \'",&local_160);
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_180);
    pPVar22 = (PyBufferProcs *)(plVar12 + 2);
    if ((PyBufferProcs *)*plVar12 == pPVar22) {
      local_128._0_8_ = pPVar22->bf_getbuffer;
      local_128._8_8_ = plVar12[3];
      local_138._0_8_ = (PyBufferProcs *)local_128;
    }
    else {
      local_128._0_8_ = pPVar22->bf_getbuffer;
      local_138._0_8_ = (PyBufferProcs *)*plVar12;
    }
    local_138._8_8_ = plVar12[1];
    *plVar12 = (long)pPVar22;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::_M_append(local_138,local_1e8._0_8_);
    psVar23 = (size_type *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar23) {
      local_1a0.field_2._M_allocated_capacity = *psVar23;
      local_1a0.field_2._8_8_ = plVar12[3];
      local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
    }
    else {
      local_1a0.field_2._M_allocated_capacity = *psVar23;
      local_1a0._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_1a0._M_string_length = plVar12[1];
    *plVar12 = (long)psVar23;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    puVar24 = (ulong *)(plVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar24) {
      local_1c8.field_2._M_allocated_capacity = *puVar24;
      local_1c8.field_2._8_8_ = plVar12[3];
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *puVar24;
      local_1c8._M_dataplus._M_p = (pointer)*plVar12;
    }
    local_1c8._M_string_length = plVar12[1];
    *plVar12 = (long)puVar24;
    plVar12[1] = 0;
    *(undefined1 *)(plVar12 + 2) = 0;
    PyErr_WarnEx(uVar28,local_1c8._M_dataplus._M_p,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if ((PyBufferProcs *)local_138._0_8_ != (PyBufferProcs *)local_128) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_128._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
      operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,
                      CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                               local_160.field_2._M_local_buf[0]) + 1);
    }
  }
  local_110 = &pfVar32->args;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  bVar35 = false;
  p_Var26 = (descrsetfunc)0x0;
  lVar31 = 0;
  do {
    bVar1 = *text;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x25) {
        pPVar18 = (PyObject *)(&local_f0->name)[lVar31];
        if (pPVar18 == (PyObject *)0x0) {
          pybind11_fail("Internal error while parsing type signature (1)");
        }
        local_1e8._0_8_ = pPVar18;
        ptVar13 = detail::get_type_info((type_index *)local_1e8,false);
        lVar31 = lVar31 + 1;
        if (ptVar13 == (type_info *)0x0) {
          if (((local_1a8->field_0x59 & 2) == 0) || (p_Var26 != (descrsetfunc)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1c8,
                       (char *)((long)&(pPVar18->ob_type->ob_base).ob_base.ob_refcnt +
                               (ulong)((char)(pPVar18->ob_type->ob_base).ob_base.ob_refcnt == '*')),
                       (allocator<char> *)&local_1a0);
            detail::clean_type_id(&local_1c8);
            local_1e8._0_8_ = local_1d8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1e8,local_1c8._M_dataplus._M_p,
                       (char *)(local_1c8._M_string_length + (long)local_1c8._M_dataplus._M_p));
            std::__cxx11::string::_M_append((char *)&local_160,local_1e8._0_8_);
            if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
              operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_0011a738;
          }
          local_138._8_8_ = (local_1a8->scope).m_ptr;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1a0,phVar14);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar24 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_1c8.field_2._M_allocated_capacity = *puVar24;
            local_1c8.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar24;
            local_1c8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1c8._M_string_length = plVar12[1];
          *plVar12 = (long)puVar24;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_e0._8_8_ = (local_1a8->scope).m_ptr;
          local_e0._16_8_ = "__qualname__";
          local_c8.m_ptr = (PyObject *)0x0;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_180,phVar14);
          uVar28 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar28 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 <
              (char *)(local_1c8._M_string_length + (long)(binaryfunc *)local_180._M_string_length))
          {
            uVar28 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              uVar28 = local_180.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar28 <
                (char *)(local_1c8._M_string_length + (long)(binaryfunc *)local_180._M_string_length
                        )) goto LAB_0011a53e;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_180,0,(char *)0x0,
                                         (ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_0011a53e:
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,(ulong)local_180._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1d8;
          pPVar15 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar15) {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar12[3];
          }
          else {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyTypeObject *)*plVar12;
          }
          local_1e8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar15;
          plVar12[1] = 0;
          *(undefined1 *)&(pPVar15->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_160,local_1e8._0_8_);
          if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          handle::dec_ref(&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          handle::dec_ref((handle *)(local_128 + 8));
        }
        else {
          pPVar15 = ptVar13->type;
          local_128._0_8_ = "__module__";
          local_128._8_8_ = (PyObject *)0x0;
          local_138._8_8_ = pPVar15;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_138
                               )->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_1a0,phVar14);
          plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          puVar24 = (ulong *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_1c8.field_2._M_allocated_capacity = *puVar24;
            local_1c8.field_2._8_8_ = plVar12[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar24;
            local_1c8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_1c8._M_string_length = plVar12[1];
          *plVar12 = (long)puVar24;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          local_e0._16_8_ = "__qualname__";
          local_c8.m_ptr = (PyObject *)0x0;
          local_e0._8_8_ = pPVar15;
          phVar14 = &detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                               ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_e0)
                     ->super_handle;
          cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_180,phVar14);
          uVar28 = (char *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            uVar28 = local_1c8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar28 <
              (char *)(local_1c8._M_string_length + (long)(binaryfunc *)local_180._M_string_length))
          {
            uVar28 = (char *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_180._M_dataplus._M_p != &local_180.field_2) {
              uVar28 = local_180.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar28 <
                (char *)(local_1c8._M_string_length + (long)(binaryfunc *)local_180._M_string_length
                        )) goto LAB_0011a2dd;
            plVar12 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_180,0,(char *)0x0,
                                         (ulong)local_1c8._M_dataplus._M_p);
          }
          else {
LAB_0011a2dd:
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1c8,(ulong)local_180._M_dataplus._M_p);
          }
          local_1e8._0_8_ = local_1d8;
          pPVar15 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar15) {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar12[3];
          }
          else {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyTypeObject *)*plVar12;
          }
          local_1e8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar15;
          plVar12[1] = 0;
          *(undefined1 *)&(pPVar15->ob_base).ob_base.ob_refcnt = 0;
          std::__cxx11::string::_M_append((char *)&local_160,local_1e8._0_8_);
          if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_180._M_dataplus._M_p != &local_180.field_2) {
            operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
          }
          handle::dec_ref(&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
          handle::dec_ref((handle *)(local_128 + 8));
        }
      }
      else {
        if (bVar1 == 0) break;
LAB_0011a189:
        std::__cxx11::string::push_back((char)&local_160);
      }
    }
    else if (bVar1 == 0x7b) {
      bVar35 = ((byte *)text)[1] == 0x2a;
      if (!bVar35) {
        if (((local_1a8->field_0x59 & 0x40) == 0) &&
           (p_Var26 == (descrsetfunc)(ulong)local_1a8->nargs_pos)) {
          std::__cxx11::string::append((char *)&local_160);
        }
        paVar30 = (local_1a8->args).
                  super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (((p_Var26 < (descrsetfunc)
                        ((long)(local_1a8->args).
                               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5)) &&
            (paVar30[(long)p_Var26].name != (char *)0x0)) ||
           ((p_Var26 == (descrsetfunc)0x0 && ((local_1a8->field_0x59 & 0x10) != 0)))) {
          std::__cxx11::string::append((char *)&local_160);
        }
        else {
          uVar34 = (long)p_Var26 - (ulong)((*(ushort *)&local_1a8->field_0x59 >> 4 & 1) != 0);
          cVar29 = '\x01';
          if (9 < uVar34) {
            uVar25 = uVar34;
            cVar8 = '\x04';
            do {
              cVar29 = cVar8;
              if (uVar25 < 100) {
                cVar29 = cVar29 + -2;
                goto LAB_0011a64e;
              }
              if (uVar25 < 1000) {
                cVar29 = cVar29 + -1;
                goto LAB_0011a64e;
              }
              if (uVar25 < 10000) goto LAB_0011a64e;
              bVar6 = 99999 < uVar25;
              uVar25 = uVar25 / 10000;
              cVar8 = cVar29 + '\x04';
            } while (bVar6);
            cVar29 = cVar29 + '\x01';
          }
LAB_0011a64e:
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_1c8,cVar29);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_1c8._M_dataplus._M_p,(uint)local_1c8._M_string_length,uVar34);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x136b8f);
          local_1e8._0_8_ = local_1d8;
          pPVar15 = (PyTypeObject *)(plVar12 + 2);
          if ((PyTypeObject *)*plVar12 == pPVar15) {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1d8._8_8_ = plVar12[3];
          }
          else {
            local_1d8._0_8_ = (pPVar15->ob_base).ob_base.ob_refcnt;
            local_1e8._0_8_ = (PyTypeObject *)*plVar12;
          }
          local_1e8._8_8_ = plVar12[1];
          *plVar12 = (long)pPVar15;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_160,local_1e8._0_8_);
          if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_160);
      }
    }
    else {
      if (bVar1 != 0x7d) goto LAB_0011a189;
      if (((!bVar35) &&
          (paVar30 = (local_1a8->args).
                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                     ._M_impl.super__Vector_impl_data._M_start,
          p_Var26 < (descrsetfunc)
                    ((long)(local_1a8->args).
                           super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar30 >> 5))) &&
         (paVar30[(long)p_Var26].descr != (char *)0x0)) {
        std::__cxx11::string::append((char *)&local_160);
        detail::replace_newlines_and_squash_abi_cxx11_
                  ((string *)local_1e8,
                   (detail *)
                   (local_110->
                   super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                   )._M_impl.super__Vector_impl_data._M_start[(long)p_Var26].descr,text_00);
        std::__cxx11::string::_M_append((char *)&local_160,local_1e8._0_8_);
        if ((PyTypeObject *)local_1e8._0_8_ != (PyTypeObject *)local_1d8) {
          operator_delete((void *)local_1e8._0_8_,(ulong)(local_1d8._0_8_ + 1));
        }
      }
      if (((descrsetfunc)(ulong)local_1a8->nargs_pos_only != (descrsetfunc)0x0) &&
         (p_Var26 + 1 == (descrsetfunc)(ulong)local_1a8->nargs_pos_only)) {
        std::__cxx11::string::append((char *)&local_160);
      }
      if (!bVar35) {
        p_Var26 = p_Var26 + 1;
      }
    }
LAB_0011a738:
    text = (char *)((byte *)text + 1);
  } while( true );
  if ((p_Var26 !=
       local_c0 +
       (-(ulong)((*(ushort *)&local_1a8->field_0x59 >> 7 & 1) != 0) -
       (ulong)(*(ushort *)&local_1a8->field_0x59 >> 6 & 1))) ||
     ((type_info *)(&local_f0->name)[lVar31] != (type_info *)0x0)) {
    pybind11_fail("Internal error while parsing type signature (2)");
  }
  pcVar11 = strdup_guard::operator()(&local_108,local_160._M_dataplus._M_p);
  pfVar32 = local_1a8;
  local_1a8->signature = pcVar11;
  if ((local_1a8->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (local_1a8->args).
      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>,_true>
    ::_S_do_it(local_110);
  }
  pfVar32->nargs = (uint16_t)local_c0;
  pPVar18 = (pfVar32->sibling).m_ptr;
  if ((pPVar18 != (PyObject *)0x0) && (pPVar18->ob_type == (PyTypeObject *)&PyInstanceMethod_Type))
  {
    (pfVar32->sibling).m_ptr = (PyObject *)pPVar18[1].ob_refcnt;
  }
  pPVar18 = (pfVar32->sibling).m_ptr;
  if (pPVar18 != (PyObject *)0x0) {
    pPVar15 = pPVar18->ob_type;
    if ((pPVar15 == (PyTypeObject *)&PyCFunction_Type) ||
       (iVar9 = PyType_IsSubtype(pPVar15,&PyCFunction_Type), iVar9 != 0)) {
      pPVar18 = (pfVar32->sibling).m_ptr;
      if ((*(byte *)(pPVar18[1].ob_refcnt + 0x10) & 0x20) == 0) {
        pPVar15 = pPVar18[1].ob_type;
      }
      else {
        pPVar15 = (PyTypeObject *)0x0;
      }
      if ((pPVar15 != (PyTypeObject *)0x0) &&
         ((pPVar15->ob_base).ob_base.ob_type == (PyTypeObject *)&PyCapsule_Type)) {
        local_1e8._0_8_ = pPVar15;
        handle::inc_ref((handle *)local_1e8);
        pcVar11 = capsule::name((capsule *)local_1e8);
        if (pcVar11 == (char *)0x0) {
          pfVar20 = capsule::get_pointer<pybind11::detail::function_record>((capsule *)local_1e8);
          pfVar27 = (function_record *)0x0;
          if ((pfVar20->scope).m_ptr == (pfVar32->scope).m_ptr) {
            pfVar27 = pfVar20;
          }
        }
        else {
          pfVar27 = (function_record *)0x0;
        }
        handle::dec_ref((handle *)local_1e8);
        goto LAB_0011a876;
      }
    }
    else if (((pfVar32->sibling).m_ptr != (PyObject *)&_Py_NoneStruct) && (*pfVar32->name != '_')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,pfVar32->name,(allocator<char> *)local_138);
      std::operator+(&local_1c8,"Cannot overload existing non-function object \"",&local_1a0);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_1e8._0_8_ = *plVar12;
      pPVar18 = (PyObject *)(plVar12 + 2);
      if ((PyObject *)local_1e8._0_8_ == pPVar18) {
        local_1d8._0_8_ = pPVar18->ob_refcnt;
        local_1d8._8_8_ = plVar12[3];
        local_1e8._0_8_ = (PyObject *)local_1d8;
      }
      else {
        local_1d8._0_8_ = pPVar18->ob_refcnt;
      }
      local_1e8._8_8_ = plVar12[1];
      *plVar12 = (long)pPVar18;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      pybind11_fail((string *)local_1e8);
    }
  }
  pfVar27 = (function_record *)0x0;
LAB_0011a876:
  pfVar20 = pfVar32;
  if (pfVar27 == (function_record *)0x0) {
    pPVar16 = (PyMethodDef *)operator_new(0x20);
    *(undefined8 *)&pPVar16->ml_flags = 0;
    pPVar16->ml_doc = (char *)0x0;
    pPVar16->ml_name = (char *)0x0;
    pPVar16->ml_meth = (PyCFunction)0x0;
    pfVar32->def = pPVar16;
    *(undefined8 *)&pPVar16->ml_flags = 0;
    pPVar16->ml_doc = (char *)0x0;
    pPVar16->ml_name = (char *)0x0;
    pPVar16->ml_meth = (PyCFunction)0x0;
    pPVar16 = pfVar32->def;
    pPVar16->ml_name = pfVar32->name;
    pPVar16->ml_meth = dispatcher;
    pPVar16->ml_flags = 3;
    uVar5._M_t.
    super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
    .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
         *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
           *)local_e8;
    *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
      *)local_e8 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                    )0x0;
    capsule::capsule((capsule *)&local_1c8,
                     (void *)uVar5._M_t.
                             super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                             ._M_t.
                             super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                             .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                             _M_head_impl,(char *)0x0,
                     initialize_generic::anon_class_1_0_00000001::__invoke);
    if (local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    local_1a0._M_dataplus._M_p = (pointer)0x0;
    pPVar18 = (pfVar32->scope).m_ptr;
    if (pPVar18 != (PyObject *)0x0) {
      iVar9 = PyObject_HasAttrString(pPVar18,"__module__");
      if (iVar9 == 1) {
        local_1e8._8_8_ = (pfVar32->scope).m_ptr;
        local_1d8._0_8_ = "__module__";
        local_1d8._8_8_ = 0;
        poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                            ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e8);
        local_138._0_8_ = (poVar17->super_handle).m_ptr;
        handle::inc_ref((handle *)local_138);
        object::operator=((object *)&local_1a0,(object *)local_138);
        handle::dec_ref((handle *)local_138);
        handle::dec_ref((handle *)(local_1d8 + 8));
      }
      else {
        iVar9 = PyObject_HasAttrString((pfVar32->scope).m_ptr,"__name__");
        if (iVar9 == 1) {
          local_1e8._8_8_ = (pfVar32->scope).m_ptr;
          local_1d8._0_8_ = "__name__";
          local_1d8._8_8_ = 0;
          poVar17 = detail::accessor<pybind11::detail::accessor_policies::str_attr>::get_cache
                              ((accessor<pybind11::detail::accessor_policies::str_attr> *)local_1e8)
          ;
          local_138._0_8_ = (poVar17->super_handle).m_ptr;
          handle::inc_ref((handle *)local_138);
          object::operator=((object *)&local_1a0,(object *)local_138);
          handle::dec_ref((handle *)local_138);
          handle::dec_ref((handle *)(local_1d8 + 8));
        }
      }
    }
    pPVar18 = (PyObject *)
              PyCMethod_New(pfVar32->def,local_1c8._M_dataplus._M_p,local_1a0._M_dataplus._M_p,0);
    local_118->m_ptr = pPVar18;
    if (pPVar18 == (PyObject *)0x0) {
      pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
    }
    handle::dec_ref((handle *)&local_1a0);
    handle::dec_ref((handle *)&local_1c8);
  }
  else {
    local_118->m_ptr = (pfVar32->sibling).m_ptr;
    handle::inc_ref(local_118);
    uVar21 = *(ushort *)&pfVar32->field_0x59;
    if (((*(ushort *)&pfVar27->field_0x59 ^ uVar21) & 0x10) != 0) {
      iVar9 = 0x137210;
      if ((uVar21 & 0x10) == 0) {
        iVar9 = 0x136d11;
      }
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,iVar9,((uVar21 & 0x10) >> 3) + iVar9 + 6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "overloading a method with both static and instance methods is not supported; error while attempting to bind "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0)
      ;
      plVar12 = (long *)std::__cxx11::string::append(local_e0);
      local_180._M_dataplus._M_p = (pointer)*plVar12;
      psVar23 = (size_type *)(plVar12 + 2);
      if ((size_type *)local_180._M_dataplus._M_p == psVar23) {
        local_180.field_2._M_allocated_capacity = *psVar23;
        local_180.field_2._8_8_ = plVar12[3];
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      }
      else {
        local_180.field_2._M_allocated_capacity = *psVar23;
      }
      local_180._M_string_length = plVar12[1];
      *plVar12 = (long)psVar23;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      local_50.obj.m_ptr = (local_1a8->scope).m_ptr;
      local_50.key = "__name__";
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      str::str<pybind11::detail::accessor_policies::str_attr>(&local_b8,&local_50);
      str::operator_cast_to_string(&local_70,&local_b8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_180,&local_70);
      plVar12 = (long *)std::__cxx11::string::append(local_138);
      local_1a0._M_dataplus._M_p = (pointer)*plVar12;
      psVar23 = (size_type *)(plVar12 + 2);
      if ((size_type *)local_1a0._M_dataplus._M_p == psVar23) {
        local_1a0.field_2._M_allocated_capacity = *psVar23;
        local_1a0.field_2._8_8_ = plVar12[3];
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
      }
      else {
        local_1a0.field_2._M_allocated_capacity = *psVar23;
      }
      local_1a0._M_string_length = plVar12[1];
      *plVar12 = (long)psVar23;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,local_1a8->name,&local_139);
      std::operator+(&local_1c8,&local_1a0,&local_90);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                     &local_1c8,&local_160);
      pybind11_fail((string *)local_1e8);
    }
    pfVar4 = pfVar27;
    if ((uVar21 >> 8 & 1) == 0) {
      do {
        pfVar20 = pfVar4;
        pfVar4 = pfVar20->next;
      } while (pfVar4 != (function_record *)0x0);
      uVar5._M_t.
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
             *)local_e8;
      *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        *)local_e8 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                      )0x0;
      pfVar20->next =
           (function_record *)
           uVar5._M_t.
           super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           ._M_t.
           super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
           .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl;
      pfVar20 = pfVar27;
      if (local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
    }
    else {
      pfVar32->next = pfVar27;
      local_1e8._0_8_ = local_118->m_ptr[1].ob_type;
      handle::inc_ref((handle *)local_1e8);
      uVar5._M_t.
      super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
      .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
           *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
             *)local_e8;
      *(__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        *)local_e8 = (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
                      )0x0;
      capsule::set_pointer
                ((capsule *)local_1e8,
                 (void *)uVar5._M_t.
                         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                         _M_head_impl);
      if (local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.strings.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      handle::dec_ref((handle *)local_1e8);
    }
  }
  pPVar18 = (PyObject *)local_1d8;
  local_1e8._8_8_ = (PyObject *)0x0;
  local_1d8._0_8_ = local_1d8._0_8_ & 0xffffffffffffff00;
  local_1e8._0_8_ = pPVar18;
  if ((pfVar27 != (function_record *)0x0) && (DAT_0014adb9 == '\x01')) {
    std::__cxx11::string::append(local_1e8);
    std::__cxx11::string::append(local_1e8);
    pPVar18 = (PyObject *)std::__cxx11::string::append(local_1e8);
  }
  uVar33 = 0;
  local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               *)CONCAT44(local_110._4_4_,(int)CONCAT71((int7)((ulong)pPVar18 >> 8),1));
  local_f0 = pfVar27;
  do {
    cVar29 = (char)local_1e8;
    if (DAT_0014adb9 == '\x01') {
      if (0 < (int)uVar33) {
        std::__cxx11::string::push_back(cVar29);
      }
      if (pfVar27 != (function_record *)0x0) {
        uVar33 = uVar33 + 1;
        __val = -uVar33;
        if (0 < (int)uVar33) {
          __val = uVar33;
        }
        __len = 1;
        if (9 < __val) {
          uVar34 = (ulong)__val;
          uVar7 = 4;
          do {
            __len = uVar7;
            uVar10 = (uint)uVar34;
            if (uVar10 < 100) {
              __len = __len - 2;
              goto LAB_0011ac13;
            }
            if (uVar10 < 1000) {
              __len = __len - 1;
              goto LAB_0011ac13;
            }
            if (uVar10 < 10000) goto LAB_0011ac13;
            uVar34 = uVar34 / 10000;
            uVar7 = __len + 4;
          } while (99999 < uVar10);
          __len = __len + 1;
        }
LAB_0011ac13:
        local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_1a0,(char)__len - (char)((int)uVar33 >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_1a0._M_dataplus._M_p + (uVar33 >> 0x1f),__len,__val);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_1a0);
        pfVar27 = local_f0;
        pfVar32 = local_1a8;
        puVar24 = (ulong *)(plVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar12 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar24) {
          local_1c8.field_2._M_allocated_capacity = *puVar24;
          local_1c8.field_2._8_8_ = plVar12[3];
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        }
        else {
          local_1c8.field_2._M_allocated_capacity = *puVar24;
          local_1c8._M_dataplus._M_p = (pointer)*plVar12;
        }
        local_1c8._M_string_length = plVar12[1];
        *plVar12 = (long)puVar24;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::string::_M_append(local_1e8,(ulong)local_1c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::string::append(local_1e8);
      std::__cxx11::string::append(local_1e8);
      std::__cxx11::string::push_back(cVar29);
    }
    if (((pfVar20->doc != (char *)0x0) && (*pfVar20->doc != '\0')) &&
       (options::global_state()::instance == '\x01')) {
      if (DAT_0014adb9 == '\0') {
        if (((ulong)local_110 & 1) == 0) {
          std::__cxx11::string::push_back(cVar29);
        }
        else {
          local_110 = (vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                       *)((ulong)local_110 & 0xffffffff00000000);
        }
      }
      if (DAT_0014adb9 == '\x01') {
        std::__cxx11::string::push_back(cVar29);
      }
      std::__cxx11::string::append(local_1e8);
      if (DAT_0014adb9 == '\x01') {
        std::__cxx11::string::push_back(cVar29);
      }
    }
    pfVar20 = pfVar20->next;
    if (pfVar20 == (function_record *)0x0) {
      pPVar18 = local_118->m_ptr;
      free(*(void **)(pPVar18[1].ob_refcnt + 0x18));
      if ((PyObject *)local_1e8._8_8_ == (PyObject *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        pcVar11 = strdup((char *)local_1e8._0_8_);
      }
      *(char **)(pPVar18[1].ob_refcnt + 0x18) = pcVar11;
      if ((pfVar32->field_0x59 & 0x10) != 0) {
        pPVar19 = (PyObject *)PyInstanceMethod_New(local_118->m_ptr);
        local_118->m_ptr = pPVar19;
        if (pPVar19 == (PyObject *)0x0) {
          pybind11_fail("cpp_function::cpp_function(): Could not allocate instance method object");
        }
        pPVar18->ob_refcnt = pPVar18->ob_refcnt + -1;
        if (pPVar18->ob_refcnt == 0) {
          _Py_Dealloc(pPVar18);
        }
      }
      if ((PyObject *)local_1e8._0_8_ != (PyObject *)local_1d8) {
        operator_delete((void *)local_1e8._0_8_,local_1d8._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,
                        CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                 local_160.field_2._M_local_buf[0]) + 1);
      }
      strdup_guard::~strdup_guard(&local_108);
      return;
    }
  } while( true );
}

Assistant:

void initialize_generic(unique_function_record &&unique_rec,
                            const char *text,
                            const std::type_info *const *types,
                            size_t args) {
        // Do NOT receive `unique_rec` by value. If this function fails to move out the unique_ptr,
        // we do not want this to destruct the pointer. `initialize` (the caller) still relies on
        // the pointee being alive after this call. Only move out if a `capsule` is going to keep
        // it alive.
        auto *rec = unique_rec.get();

        // Keep track of strdup'ed strings, and clean them up as long as the function's capsule
        // has not taken ownership yet (when `unique_rec.release()` is called).
        // Note: This cannot easily be fixed by a `unique_ptr` with custom deleter, because the
        // strings are only referenced before strdup'ing. So only *after* the following block could
        // `destruct` safely be called, but even then, `repr` could still throw in the middle of
        // copying all strings.
        strdup_guard guarded_strdup;

        /* Create copies of all referenced C-style strings */
        rec->name = guarded_strdup(rec->name ? rec->name : "");
        if (rec->doc) {
            rec->doc = guarded_strdup(rec->doc);
        }
        for (auto &a : rec->args) {
            if (a.name) {
                a.name = guarded_strdup(a.name);
            }
            if (a.descr) {
                a.descr = guarded_strdup(a.descr);
            } else if (a.value) {
                a.descr = guarded_strdup(repr(a.value).cast<std::string>().c_str());
            }
        }

        rec->is_constructor = (std::strcmp(rec->name, "__init__") == 0)
                              || (std::strcmp(rec->name, "__setstate__") == 0);

#if defined(PYBIND11_DETAILED_ERROR_MESSAGES) && !defined(PYBIND11_DISABLE_NEW_STYLE_INIT_WARNING)
        if (rec->is_constructor && !rec->is_new_style_constructor) {
            const auto class_name
                = detail::get_fully_qualified_tp_name((PyTypeObject *) rec->scope.ptr());
            const auto func_name = std::string(rec->name);
            PyErr_WarnEx(PyExc_FutureWarning,
                         ("pybind11-bound class '" + class_name
                          + "' is using an old-style "
                            "placement-new '"
                          + func_name
                          + "' which has been deprecated. See "
                            "the upgrade guide in pybind11's docs. This message is only visible "
                            "when compiled in debug mode.")
                             .c_str(),
                         0);
        }
#endif

        /* Generate a proper function signature */
        std::string signature;
        size_t type_index = 0, arg_index = 0;
        bool is_starred = false;
        for (const auto *pc = text; *pc != '\0'; ++pc) {
            const auto c = *pc;

            if (c == '{') {
                // Write arg name for everything except *args and **kwargs.
                is_starred = *(pc + 1) == '*';
                if (is_starred) {
                    continue;
                }
                // Separator for keyword-only arguments, placed before the kw
                // arguments start (unless we are already putting an *args)
                if (!rec->has_args && arg_index == rec->nargs_pos) {
                    signature += "*, ";
                }
                if (arg_index < rec->args.size() && rec->args[arg_index].name) {
                    signature += rec->args[arg_index].name;
                } else if (arg_index == 0 && rec->is_method) {
                    signature += "self";
                } else {
                    signature += "arg" + std::to_string(arg_index - (rec->is_method ? 1 : 0));
                }
                signature += ": ";
            } else if (c == '}') {
                // Write default value if available.
                if (!is_starred && arg_index < rec->args.size() && rec->args[arg_index].descr) {
                    signature += " = ";
                    signature += detail::replace_newlines_and_squash(rec->args[arg_index].descr);
                }
                // Separator for positional-only arguments (placed after the
                // argument, rather than before like *
                if (rec->nargs_pos_only > 0 && (arg_index + 1) == rec->nargs_pos_only) {
                    signature += ", /";
                }
                if (!is_starred) {
                    arg_index++;
                }
            } else if (c == '%') {
                const std::type_info *t = types[type_index++];
                if (!t) {
                    pybind11_fail("Internal error while parsing type signature (1)");
                }
                if (auto *tinfo = detail::get_type_info(*t)) {
                    handle th((PyObject *) tinfo->type);
                    signature += th.attr("__module__").cast<std::string>() + "."
                                 + th.attr("__qualname__").cast<std::string>();
                } else if (rec->is_new_style_constructor && arg_index == 0) {
                    // A new-style `__init__` takes `self` as `value_and_holder`.
                    // Rewrite it to the proper class type.
                    signature += rec->scope.attr("__module__").cast<std::string>() + "."
                                 + rec->scope.attr("__qualname__").cast<std::string>();
                } else {
                    signature += detail::quote_cpp_type_name(detail::clean_type_id(t->name()));
                }
            } else {
                signature += c;
            }
        }

        if (arg_index != args - rec->has_args - rec->has_kwargs || types[type_index] != nullptr) {
            pybind11_fail("Internal error while parsing type signature (2)");
        }

        rec->signature = guarded_strdup(signature.c_str());
        rec->args.shrink_to_fit();
        rec->nargs = (std::uint16_t) args;

        if (rec->sibling && PYBIND11_INSTANCE_METHOD_CHECK(rec->sibling.ptr())) {
            rec->sibling = PYBIND11_INSTANCE_METHOD_GET_FUNCTION(rec->sibling.ptr());
        }

        detail::function_record *chain = nullptr, *chain_start = rec;
        if (rec->sibling) {
            if (PyCFunction_Check(rec->sibling.ptr())) {
                auto *self = PyCFunction_GET_SELF(rec->sibling.ptr());
                if (!isinstance<capsule>(self)) {
                    chain = nullptr;
                } else {
                    auto rec_capsule = reinterpret_borrow<capsule>(self);
                    if (detail::is_function_record_capsule(rec_capsule)) {
                        chain = rec_capsule.get_pointer<detail::function_record>();
                        /* Never append a method to an overload chain of a parent class;
                           instead, hide the parent's overloads in this case */
                        if (!chain->scope.is(rec->scope)) {
                            chain = nullptr;
                        }
                    } else {
                        chain = nullptr;
                    }
                }
            }
            // Don't trigger for things like the default __init__, which are wrapper_descriptors
            // that we are intentionally replacing
            else if (!rec->sibling.is_none() && rec->name[0] != '_') {
                pybind11_fail("Cannot overload existing non-function object \""
                              + std::string(rec->name) + "\" with a function of the same name");
            }
        }

        if (!chain) {
            /* No existing overload was found, create a new function object */
            rec->def = new PyMethodDef();
            std::memset(rec->def, 0, sizeof(PyMethodDef));
            rec->def->ml_name = rec->name;
            rec->def->ml_meth
                = reinterpret_cast<PyCFunction>(reinterpret_cast<void (*)()>(dispatcher));
            rec->def->ml_flags = METH_VARARGS | METH_KEYWORDS;

            capsule rec_capsule(unique_rec.release(),
                                detail::get_function_record_capsule_name(),
                                [](void *ptr) { destruct((detail::function_record *) ptr); });
            guarded_strdup.release();

            object scope_module;
            if (rec->scope) {
                if (hasattr(rec->scope, "__module__")) {
                    scope_module = rec->scope.attr("__module__");
                } else if (hasattr(rec->scope, "__name__")) {
                    scope_module = rec->scope.attr("__name__");
                }
            }

            m_ptr = PyCFunction_NewEx(rec->def, rec_capsule.ptr(), scope_module.ptr());
            if (!m_ptr) {
                pybind11_fail("cpp_function::cpp_function(): Could not allocate function object");
            }
        } else {
            /* Append at the beginning or end of the overload chain */
            m_ptr = rec->sibling.ptr();
            inc_ref();
            if (chain->is_method != rec->is_method) {
                pybind11_fail(
                    "overloading a method with both static and instance methods is not supported; "
#if !defined(PYBIND11_DETAILED_ERROR_MESSAGES)
                    "#define PYBIND11_DETAILED_ERROR_MESSAGES or compile in debug mode for more "
                    "details"
#else
                    "error while attempting to bind "
                    + std::string(rec->is_method ? "instance" : "static") + " method "
                    + std::string(pybind11::str(rec->scope.attr("__name__"))) + "."
                    + std::string(rec->name) + signature
#endif
                );
            }

            if (rec->prepend) {
                // Beginning of chain; we need to replace the capsule's current head-of-the-chain
                // pointer with this one, then make this one point to the previous head of the
                // chain.
                chain_start = rec;
                rec->next = chain;
                auto rec_capsule
                    = reinterpret_borrow<capsule>(((PyCFunctionObject *) m_ptr)->m_self);
                rec_capsule.set_pointer(unique_rec.release());
                guarded_strdup.release();
            } else {
                // Or end of chain (normal behavior)
                chain_start = chain;
                while (chain->next) {
                    chain = chain->next;
                }
                chain->next = unique_rec.release();
                guarded_strdup.release();
            }
        }

        std::string signatures;
        int index = 0;
        /* Create a nice pydoc rec including all signatures and
           docstrings of the functions in the overload chain */
        if (chain && options::show_function_signatures()) {
            // First a generic signature
            signatures += rec->name;
            signatures += "(*args, **kwargs)\n";
            signatures += "Overloaded function.\n\n";
        }
        // Then specific overload signatures
        bool first_user_def = true;
        for (auto *it = chain_start; it != nullptr; it = it->next) {
            if (options::show_function_signatures()) {
                if (index > 0) {
                    signatures += '\n';
                }
                if (chain) {
                    signatures += std::to_string(++index) + ". ";
                }
                signatures += rec->name;
                signatures += it->signature;
                signatures += '\n';
            }
            if (it->doc && it->doc[0] != '\0' && options::show_user_defined_docstrings()) {
                // If we're appending another docstring, and aren't printing function signatures,
                // we need to append a newline first:
                if (!options::show_function_signatures()) {
                    if (first_user_def) {
                        first_user_def = false;
                    } else {
                        signatures += '\n';
                    }
                }
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
                signatures += it->doc;
                if (options::show_function_signatures()) {
                    signatures += '\n';
                }
            }
        }

        /* Install docstring */
        auto *func = (PyCFunctionObject *) m_ptr;
        std::free(const_cast<char *>(func->m_ml->ml_doc));
        // Install docstring if it's non-empty (when at least one option is enabled)
        func->m_ml->ml_doc
            = signatures.empty() ? nullptr : PYBIND11_COMPAT_STRDUP(signatures.c_str());

        if (rec->is_method) {
            m_ptr = PYBIND11_INSTANCE_METHOD_NEW(m_ptr, rec->scope.ptr());
            if (!m_ptr) {
                pybind11_fail(
                    "cpp_function::cpp_function(): Could not allocate instance method object");
            }
            Py_DECREF(func);
        }
    }